

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustach.c
# Opt level: O2

int process(char *template,mustach_itf *itf,void *closure,FILE *file,char *opstr,char *clstr)

{
  char cVar1;
  long lVar2;
  _func_int_void_ptr_char_ptr *p_Var3;
  void *pvVar4;
  _func_int_void_ptr *p_Var5;
  _func_int_void_ptr_char_ptr_int_FILE_ptr *p_Var6;
  long lVar7;
  mustach_itf *itf_00;
  byte *pbVar8;
  int iVar9;
  int iVar10;
  char *pcVar11;
  ushort **ppuVar12;
  FILE *pFVar13;
  long lVar14;
  size_t __size;
  uint uVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  char *pcVar19;
  char *pcVar20;
  int iVar21;
  char *pcVar22;
  char *pcVar23;
  byte bVar24;
  char *pcVar25;
  char *pcVar26;
  size_t sVar27;
  long in_FS_OFFSET;
  bool bVar28;
  undefined1 auStack_24a8 [8];
  char *local_24a0;
  size_t local_2498;
  char *local_2490;
  char *local_2488;
  FILE *local_2480;
  void *local_2478;
  mustach_itf *local_2470;
  char *local_2468;
  int local_2460;
  byte local_2459;
  char *local_2458;
  size_t local_2450 [2];
  anon_struct_32_5_7b674a85 stack [256];
  char name [1025];
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_2490 = opstr;
  local_2480 = (FILE *)file;
  local_2478 = closure;
  local_2470 = itf;
  local_2468 = template;
  local_24a0 = (char *)strlen(opstr);
  local_2488 = clstr;
  local_2498 = strlen(clstr);
  local_2460 = 0;
  pcVar19 = auStack_24a8;
  iVar9 = 1;
LAB_00104b19:
  do {
    do {
      iVar21 = iVar9;
      pcVar23 = local_2468;
      pcVar11 = local_2490;
      builtin_strncpy(pcVar19 + -8,"2K\x10",4);
      pcVar19[-4] = '\0';
      pcVar19[-3] = '\0';
      pcVar19[-2] = '\0';
      pcVar19[-1] = '\0';
      pcVar11 = strstr(pcVar23,pcVar11);
      if (pcVar11 == (char *)0x0) {
        if (iVar21 != 0) {
          pcVar19[-8] = -0x3d;
          pcVar19[-7] = 'P';
          pcVar19[-6] = '\x10';
          pcVar19[-5] = '\0';
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          __size = strlen(pcVar23);
          pcVar19[-8] = '\x01';
          pFVar13 = local_2480;
          pcVar19[-7] = '\0';
          pcVar19[-6] = '\0';
          pcVar19[-5] = '\0';
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          sVar27 = *(size_t *)(pcVar19 + -8);
          pcVar19[-8] = -0x28;
          pcVar19[-7] = 'P';
          pcVar19[-6] = '\x10';
          pcVar19[-5] = '\0';
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          fwrite(pcVar23,__size,sVar27,pFVar13);
        }
        iVar10 = (uint)(local_2460 == 0) * 2 + -2;
        goto LAB_0010508d;
      }
      if (iVar21 != 0) {
        pcVar19[-8] = '\x01';
        pFVar13 = local_2480;
        pcVar19[-7] = '\0';
        pcVar19[-6] = '\0';
        pcVar19[-5] = '\0';
        pcVar19[-4] = '\0';
        pcVar19[-3] = '\0';
        pcVar19[-2] = '\0';
        pcVar19[-1] = '\0';
        builtin_strncpy(pcVar19 + -8,"[K\x10",4);
        pcVar19[-4] = '\0';
        pcVar19[-3] = '\0';
        pcVar19[-2] = '\0';
        pcVar19[-1] = '\0';
        fwrite(pcVar23,(long)pcVar11 - (long)pcVar23,*(size_t *)(pcVar19 + -8),pFVar13);
      }
      pcVar23 = local_2488;
      pbVar17 = (byte *)(pcVar11 + (long)local_24a0);
      builtin_strncpy(pcVar19 + -8,"tK\x10",4);
      pcVar19[-4] = '\0';
      pcVar19[-3] = '\0';
      pcVar19[-2] = '\0';
      pcVar19[-1] = '\0';
      pcVar11 = strstr((char *)pbVar17,pcVar23);
      if (pcVar11 == (char *)0x0) {
        pcVar20 = pcVar19 + -8;
        pcVar19[-8] = -2;
        pcVar19[-7] = -1;
        pcVar19[-6] = -1;
        pcVar19[-5] = -1;
        pcVar19[-4] = -1;
        pcVar19[-3] = -1;
        pcVar19[-2] = -1;
        pcVar19[-1] = -1;
LAB_0010508b:
        iVar10 = (int)*(undefined8 *)pcVar20;
        pcVar19 = (char *)((long)pcVar20 + 8);
        goto LAB_0010508d;
      }
      pcVar22 = pcVar11 + local_2498;
      pcVar26 = pcVar11 + -(long)pbVar17;
      bVar24 = *pbVar17;
      uVar15 = bVar24 - 0x21;
      if (uVar15 < 0x3e) {
        if ((0x2000000020004024U >> ((ulong)uVar15 & 0x3f) & 1) != 0) {
          local_2459 = bVar24;
          goto LAB_00104bbc;
        }
        if ((0x10000001UL >> ((ulong)uVar15 & 0x3f) & 1) == 0) goto LAB_00104ce8;
        local_2468 = pcVar22;
      }
      else {
LAB_00104ce8:
        if (bVar24 == 0x7b) {
          for (lVar14 = 0; cVar1 = pcVar23[lVar14], cVar1 == '}'; lVar14 = lVar14 + 1) {
          }
          if (cVar1 == '\0') {
            if (pcVar11[lVar14] != '}') {
LAB_001050fe:
              pcVar20 = pcVar19 + -8;
              pcVar19[-8] = -8;
              pcVar19[-7] = -1;
              pcVar19[-6] = -1;
              pcVar19[-5] = -1;
              pcVar19[-4] = -1;
              pcVar19[-3] = -1;
              pcVar19[-2] = -1;
              pcVar19[-1] = -1;
              goto LAB_0010508b;
            }
            pcVar22 = pcVar22 + 1;
          }
          else {
            if ((pcVar26 == (char *)0x0) || ((pbVar17 + -1)[(long)pcVar26] != 0x7d))
            goto LAB_001050fe;
            pcVar26 = pcVar26 + -1;
          }
          local_2459 = 0x26;
LAB_00104bbc:
          local_2468 = pcVar22;
          pbVar17 = pbVar17 + 1;
          pcVar11 = pcVar26 + -1;
        }
        else {
          local_2459 = bVar24;
          local_2468 = pcVar22;
          pcVar11 = pcVar26;
        }
        pbVar18 = pbVar17 + (long)pcVar11;
        pcVar26 = pcVar11 + 1;
        while (bVar28 = pcVar11 != (char *)0x0, pcVar11 = pcVar11 + -1, bVar24 = local_2459,
              pbVar8 = pbVar18, bVar28) {
          pcVar19[-8] = -0x1d;
          pcVar19[-7] = 'K';
          pcVar19[-6] = '\x10';
          pcVar19[-5] = '\0';
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          ppuVar12 = __ctype_b_loc();
          bVar24 = local_2459;
          pbVar8 = pbVar17;
          if ((*(byte *)((long)*ppuVar12 + (long)(char)*pbVar17 * 2 + 1) & 0x20) == 0) break;
          pbVar17 = pbVar17 + 1;
          pcVar26 = pcVar26 + -1;
        }
        do {
          pbVar17 = pbVar8;
          if (pcVar26 == (char *)0x1) {
            pcVar20 = pcVar19 + -8;
            pcVar19[-8] = -3;
            pcVar19[-7] = -1;
            pcVar19[-6] = -1;
            pcVar19[-5] = -1;
            pcVar19[-4] = -1;
            pcVar19[-3] = -1;
            pcVar19[-2] = -1;
            pcVar19[-1] = -1;
            goto LAB_0010508b;
          }
          builtin_strncpy(pcVar19 + -8,"\x16L\x10",4);
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          ppuVar12 = __ctype_b_loc();
          pbVar18 = pbVar17 + -2 + (long)pcVar26;
          pcVar26 = pcVar26 + -1;
          pbVar8 = pbVar17;
        } while ((*(byte *)((long)*ppuVar12 + (long)(char)*pbVar18 * 2 + 1) & 0x20) != 0);
        if ((char *)0x400 < pcVar26) {
          pcVar20 = pcVar19 + -8;
          pcVar19[-8] = -4;
          pcVar19[-7] = -1;
          pcVar19[-6] = -1;
          pcVar19[-5] = -1;
          pcVar19[-4] = -1;
          pcVar19[-3] = -1;
          pcVar19[-2] = -1;
          pcVar19[-1] = -1;
          goto LAB_0010508b;
        }
        builtin_strncpy(pcVar19 + -8,"HL\x10",4);
        pcVar19[-4] = '\0';
        pcVar19[-3] = '\0';
        pcVar19[-2] = '\0';
        pcVar19[-1] = '\0';
        memcpy(&stack[0xff].emit,pbVar17,(size_t)pcVar26);
        *(char *)((long)&stack[0xff].emit + (long)pcVar26) = '\0';
      }
      pvVar4 = local_2478;
      pFVar13 = local_2480;
      iVar9 = iVar21;
    } while (bVar24 == 0x21);
    if (bVar24 != 0x23) {
      if (bVar24 == 0x2f) {
        iVar16 = local_2460 + -1;
        if ((local_2460 != 0) && (pcVar26 == stack[iVar16].again)) {
          pvVar4 = *(void **)&stack[(long)iVar16 + -1].emit;
          pcVar19[-8] = -0x4c;
          pcVar19[-7] = 'M';
          pcVar19[-6] = '\x10';
          pcVar19[-5] = '\0';
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          iVar10 = bcmp(pvVar4,&stack[0xff].emit,(size_t)pcVar26);
          pvVar4 = local_2478;
          if (iVar10 == 0) {
            if ((iVar21 != 0) && (*(int *)((long)&stack[iVar16].length + 4) != 0)) {
              p_Var5 = local_2470->next;
              pcVar19[-8] = -0x1c;
              pcVar19[-7] = 'M';
              pcVar19[-6] = '\x10';
              pcVar19[-5] = '\0';
              pcVar19[-4] = '\0';
              pcVar19[-3] = '\0';
              pcVar19[-2] = '\0';
              pcVar19[-1] = '\0';
              iVar10 = (*p_Var5)(pvVar4);
              if (iVar10 < 0) goto LAB_0010508d;
              if (iVar10 != 0) {
                local_2468 = stack[iVar16].name;
                goto LAB_00104b19;
              }
            }
            pvVar4 = local_2478;
            iVar21 = (int)stack[iVar16].length;
            local_2460 = iVar16;
            iVar9 = 0;
            if ((iVar21 != 0) &&
               (local_2460 = iVar16, iVar9 = iVar21, *(int *)((long)&stack[iVar16].length + 4) != 0)
               ) {
              p_Var5 = local_2470->leave;
              pcVar19[-8] = -0x52;
              pcVar19[-7] = 'O';
              pcVar19[-6] = '\x10';
              pcVar19[-5] = '\0';
              pcVar19[-4] = '\0';
              pcVar19[-3] = '\0';
              pcVar19[-2] = '\0';
              pcVar19[-1] = '\0';
              (*p_Var5)(pvVar4);
              local_2460 = iVar16;
            }
            goto LAB_00104b19;
          }
        }
        pcVar20 = pcVar19 + -8;
        pcVar19[-8] = -7;
        pcVar19[-7] = -1;
        pcVar19[-6] = -1;
        pcVar19[-5] = -1;
        pcVar19[-4] = -1;
        pcVar19[-3] = -1;
        pcVar19[-2] = -1;
        pcVar19[-1] = -1;
        goto LAB_0010508b;
      }
      if (bVar24 == 0x5e) goto LAB_00104cfe;
      if (bVar24 != 0x3e) {
        if (bVar24 != 0x3d) {
          iVar9 = 0;
          if (iVar21 != 0) {
            p_Var6 = local_2470->put;
            pcVar19[-8] = -0x1c;
            pcVar19[-7] = 'N';
            pcVar19[-6] = '\x10';
            pcVar19[-5] = '\0';
            pcVar19[-4] = '\0';
            pcVar19[-3] = '\0';
            pcVar19[-2] = '\0';
            pcVar19[-1] = '\0';
            iVar10 = (*p_Var6)(pvVar4,(char *)&stack[0xff].emit,SUB14(bVar24 != 0x26,0),
                               (FILE *)pFVar13);
LAB_00104eec:
            iVar9 = iVar21;
            if (iVar10 < 0) {
LAB_0010508d:
              if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
                *(code **)(pcVar19 + -8) = fdmustach;
                __stack_chk_fail();
              }
              return iVar10;
            }
          }
          goto LAB_00104b19;
        }
        pcVar11 = pcVar19;
        if (((char *)0x4 < pcVar26) && ((pcVar26 + -1)[(long)pbVar17] == '=')) {
          pbVar17 = pbVar17 + 1;
          pcVar26 = pcVar26 + -2;
          pcVar23 = (char *)0x0;
          while( true ) {
            if (pcVar26 == pcVar23) goto LAB_001050b2;
            pcVar19[-8] = -0x30;
            pcVar19[-7] = 'L';
            pcVar19[-6] = '\x10';
            pcVar19[-5] = '\0';
            pcVar19[-4] = '\0';
            pcVar19[-3] = '\0';
            pcVar19[-2] = '\0';
            pcVar19[-1] = '\0';
            ppuVar12 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar12 + (long)(char)pbVar17[(long)pcVar23] * 2 + 1) & 0x20) !=
                0) break;
            pcVar23 = pcVar23 + 1;
          }
          if (pcVar26 != pcVar23) {
            lVar14 = -((ulong)(pcVar23 + 0x10) & 0xfffffffffffffff0);
            pcVar11 = pcVar19 + lVar14;
            builtin_strncpy(pcVar19 + lVar14 + -8,"\tP\x10",4);
            pcVar11[-4] = '\0';
            pcVar11[-3] = '\0';
            pcVar11[-2] = '\0';
            pcVar11[-1] = '\0';
            memcpy(pcVar11,pbVar17,(size_t)pcVar23);
            local_2490 = pcVar11;
            pcVar23[(long)pcVar11] = '\0';
            pcVar22 = pcVar26;
            if (pcVar26 < pcVar23) {
              pcVar22 = pcVar23;
            }
            local_24a0 = pcVar23;
            for (; pcVar25 = pcVar22, pcVar23 < pcVar26; pcVar23 = pcVar23 + 1) {
              builtin_strncpy(pcVar19 + lVar14 + -8,"0P\x10",4);
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              ppuVar12 = __ctype_b_loc();
              pcVar25 = pcVar23;
              if ((*(byte *)((long)*ppuVar12 + (long)(char)pbVar17[(long)pcVar23] * 2 + 1) & 0x20)
                  == 0) break;
            }
            sVar27 = (long)pcVar26 - (long)pcVar25;
            if (sVar27 != 0) {
              lVar7 = -(sVar27 + 0x10 & 0xfffffffffffffff0);
              pcVar11 = pcVar11 + lVar7;
              builtin_strncpy(pcVar19 + lVar7 + lVar14 + -8,"nP\x10",4);
              pcVar11[-4] = '\0';
              pcVar11[-3] = '\0';
              pcVar11[-2] = '\0';
              pcVar11[-1] = '\0';
              memcpy(pcVar11,pbVar17 + (long)pcVar25,sVar27);
              local_2488 = pcVar11;
              pcVar11[sVar27] = '\0';
              pcVar19 = pcVar11;
              local_2498 = sVar27;
              goto LAB_00104b19;
            }
          }
        }
LAB_001050b2:
        pcVar20 = pcVar11 + -8;
        pcVar11[-8] = -5;
        pcVar11[-7] = -1;
        pcVar11[-6] = -1;
        pcVar11[-5] = -1;
        pcVar11[-4] = -1;
        pcVar11[-3] = -1;
        pcVar11[-2] = -1;
        pcVar11[-1] = -1;
        goto LAB_0010508b;
      }
      iVar9 = 0;
      if (iVar21 != 0) {
        local_2458 = (char *)0x0;
        builtin_strncpy(pcVar19 + -8,"\x1dN\x10",4);
        pcVar19[-4] = '\0';
        pcVar19[-3] = '\0';
        pcVar19[-2] = '\0';
        pcVar19[-1] = '\0';
        pFVar13 = tmpfile();
        pvVar4 = local_2478;
        if (pFVar13 != (FILE *)0x0) {
          p_Var6 = local_2470->put;
          builtin_strncpy(pcVar19 + -8,"FN\x10",4);
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          iVar10 = (*p_Var6)(pvVar4,(char *)&stack[0xff].emit,0,(FILE *)pFVar13);
          if (iVar10 < 0) {
            builtin_strncpy(pcVar19 + -8,"\x11Q\x10",4);
            pcVar19[-4] = '\0';
            pcVar19[-3] = '\0';
            pcVar19[-2] = '\0';
            pcVar19[-1] = '\0';
            fclose(pFVar13);
            goto LAB_0010508d;
          }
          builtin_strncpy(pcVar19 + -8,"dN\x10",4);
          pcVar19[-4] = '\0';
          pcVar19[-3] = '\0';
          pcVar19[-2] = '\0';
          pcVar19[-1] = '\0';
          iVar9 = memfile_close((FILE *)pFVar13,&local_2458,local_2450);
          pcVar22 = local_2458;
          itf_00 = local_2470;
          pvVar4 = local_2478;
          pFVar13 = local_2480;
          pcVar23 = local_2488;
          pcVar11 = local_2490;
          if (iVar9 == 0) {
            pcVar19[-8] = -0x62;
            pcVar19[-7] = 'N';
            pcVar19[-6] = '\x10';
            pcVar19[-5] = '\0';
            pcVar19[-4] = '\0';
            pcVar19[-3] = '\0';
            pcVar19[-2] = '\0';
            pcVar19[-1] = '\0';
            iVar10 = process(pcVar22,itf_00,pvVar4,(FILE *)pFVar13,pcVar11,pcVar23);
            pcVar19[-8] = -0x54;
            pcVar19[-7] = 'N';
            pcVar19[-6] = '\x10';
            pcVar19[-5] = '\0';
            pcVar19[-4] = '\0';
            pcVar19[-3] = '\0';
            pcVar19[-2] = '\0';
            pcVar19[-1] = '\0';
            free(pcVar22);
            goto LAB_00104eec;
          }
        }
        pcVar20 = pcVar19 + -8;
        pcVar19[-8] = -1;
        pcVar19[-7] = -1;
        pcVar19[-6] = -1;
        pcVar19[-5] = -1;
        pcVar19[-4] = -1;
        pcVar19[-3] = -1;
        pcVar19[-2] = -1;
        pcVar19[-1] = -1;
        goto LAB_0010508b;
      }
      goto LAB_00104b19;
    }
LAB_00104cfe:
    if (local_2460 == 0x100) {
      pcVar20 = pcVar19 + -8;
      pcVar19[-8] = -6;
      pcVar19[-7] = -1;
      pcVar19[-6] = -1;
      pcVar19[-5] = -1;
      pcVar19[-4] = -1;
      pcVar19[-3] = -1;
      pcVar19[-2] = -1;
      pcVar19[-1] = -1;
      goto LAB_0010508b;
    }
    if (iVar21 == 0) {
      iVar10 = 0;
    }
    else {
      p_Var3 = local_2470->enter;
      builtin_strncpy(pcVar19 + -8,"2M\x10",4);
      pcVar19[-4] = '\0';
      pcVar19[-3] = '\0';
      pcVar19[-2] = '\0';
      pcVar19[-1] = '\0';
      iVar10 = (*p_Var3)(pvVar4,(char *)&stack[0xff].emit);
      if (iVar10 < 0) goto LAB_0010508d;
    }
    local_2468 = local_2468 + (*local_2468 == '\n');
    lVar14 = (long)local_2460;
    *(byte **)&stack[lVar14 + -1].emit = pbVar17;
    stack[lVar14].name = local_2468;
    stack[lVar14].again = pcVar26;
    *(int *)&stack[lVar14].length = iVar21;
    *(int *)((long)&stack[lVar14].length + 4) = iVar10;
    if ((iVar10 != 0) != (bVar24 == 0x23)) {
      iVar21 = 0;
    }
    local_2460 = local_2460 + 1;
    iVar9 = iVar21;
  } while( true );
}

Assistant:

static int process(const char *template, struct mustach_itf *itf, void *closure, FILE *file, const char *opstr, const char *clstr)
{
	char name[NAME_LENGTH_MAX + 1], *partial, c, *tmp;
	const char *beg, *term;
	struct { const char *name, *again; size_t length; int emit, entered; } stack[DEPTH_MAX];
	size_t oplen, cllen, len, l;
	int depth, rc, emit;

	emit = 1;
	oplen = strlen(opstr);
	cllen = strlen(clstr);
	depth = 0;
	for(;;) {
		beg = strstr(template, opstr);
		if (beg == NULL) {
			/* no more mustach */
			if (emit)
				fwrite(template, strlen(template), 1, file);
			return depth ? MUSTACH_ERROR_UNEXPECTED_END : 0;
		}
		if (emit)
			fwrite(template, (size_t)(beg - template), 1, file);
		beg += oplen;
		term = strstr(beg, clstr);
		if (term == NULL)
			return MUSTACH_ERROR_UNEXPECTED_END;
		template = term + cllen;
		len = (size_t)(term - beg);
		c = *beg;
		switch(c) {
		case '!':
		case '=':
			break;
		case '{':
			for (l = 0 ; clstr[l] == '}' ; l++);
			if (clstr[l]) {
				if (!len || beg[len-1] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				len--;
			} else {
				if (term[l] != '}')
					return MUSTACH_ERROR_BAD_UNESCAPE_TAG;
				template++;
			}
			c = '&';
			/*@fallthrough@*/
		case '^':
		case '#':
		case '/':
		case '&':
		case '>':
#if !defined(NO_EXTENSION_FOR_MUSTACH) && !defined(NO_COLON_EXTENSION_FOR_MUSTACH)
		case ':':
#endif
			beg++; len--;
		default:
			while (len && isspace(beg[0])) { beg++; len--; }
			while (len && isspace(beg[len-1])) len--;
#if defined(NO_EXTENSION_FOR_MUSTACH) || defined(NO_ALLOW_EMPTY_TAG)
			if (len == 0)
				return MUSTACH_ERROR_EMPTY_TAG;
#endif
			if (len > NAME_LENGTH_MAX)
				return MUSTACH_ERROR_TAG_TOO_LONG;
			memcpy(name, beg, len);
			name[len] = 0;
			break;
		}
		switch(c) {
		case '!':
			/* comment */
			/* nothing to do */
			break;
		case '=':
			/* defines separators */
			if (len < 5 || beg[len - 1] != '=')
				return MUSTACH_ERROR_BAD_SEPARATORS;
			beg++;
			len -= 2;
			for (l = 0; l < len && !isspace(beg[l]) ; l++);
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			oplen = l;
			tmp = alloca(oplen + 1);
			memcpy(tmp, beg, oplen);
			tmp[oplen] = 0;
			opstr = tmp;
			while (l < len && isspace(beg[l])) l++;
			if (l == len)
				return MUSTACH_ERROR_BAD_SEPARATORS;
			cllen = len - l;
			tmp = alloca(cllen + 1);
			memcpy(tmp, beg + l, cllen);
			tmp[cllen] = 0;
			clstr = tmp;
			break;
		case '^':
		case '#':
			/* begin section */
			if (depth == DEPTH_MAX)
				return MUSTACH_ERROR_TOO_DEEP;
			rc = emit;
			if (rc) {
				rc = itf->enter(closure, name);
				if (rc < 0)
					return rc;
			}

			if (template[0] == '\n')
				++template;

			stack[depth].name = beg;
			stack[depth].again = template;
			stack[depth].length = len;
			stack[depth].emit = emit;
			stack[depth].entered = rc;
			if ((c == '#') == (rc == 0))
				emit = 0;
			depth++;
			break;
		case '/':
			/* end section */
			if (depth-- == 0 || len != stack[depth].length || memcmp(stack[depth].name, name, len))
				return MUSTACH_ERROR_CLOSING;
			rc = emit && stack[depth].entered ? itf->next(closure) : 0;
			if (rc < 0)
				return rc;
			if (rc) {
				template = stack[depth++].again;
			} else {
				emit = stack[depth].emit;
				if (emit && stack[depth].entered)
					itf->leave(closure);
			}
			break;
		case '>':
			/* partials */
			if (emit) {
				rc = getpartial(itf, closure, name, &partial);
				if (rc == 0) {
					rc = process(partial, itf, closure, file, opstr, clstr);
					free(partial);
				}
				if (rc < 0)
					return rc;
			}
			break;
		default:
			/* replacement */
			if (emit) {
				rc = itf->put(closure, name, c != '&', file);
				if (rc < 0)
					return rc;
			}
			break;
		}
	}
}